

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadTEXS(B3DImporter *this)

{
  uint uVar1;
  undefined1 local_30 [8];
  string name;
  B3DImporter *this_local;
  
  name.field_2._8_8_ = this;
  while( true ) {
    uVar1 = ChunkSize(this);
    if (uVar1 == 0) break;
    ReadString_abi_cxx11_((string *)local_30,this);
    ReadInt(this);
    ReadInt(this);
    ReadVec2(this);
    ReadVec2(this);
    ReadFloat(this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_textures,(value_type *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void B3DImporter::ReadTEXS(){
    while( ChunkSize() ){
        string name=ReadString();
        /*int flags=*/ReadInt();
        /*int blend=*/ReadInt();
        /*aiVector2D pos=*/ReadVec2();
        /*aiVector2D scale=*/ReadVec2();
        /*float rot=*/ReadFloat();

        _textures.push_back( name );
    }
}